

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

jx9_aux_data * ContextFindChunk(jx9_context *pCtx,void *pChunk)

{
  jx9_aux_data *pjVar1;
  uint local_34;
  sxu32 n;
  jx9_aux_data *pAux;
  jx9_aux_data *aAux;
  void *pChunk_local;
  jx9_context *pCtx_local;
  
  if ((pCtx->sChunk).nUsed != 0) {
    for (local_34 = 0; local_34 < (pCtx->sChunk).nUsed; local_34 = local_34 + 1) {
      pjVar1 = (jx9_aux_data *)((long)(pCtx->sChunk).pBase + (ulong)local_34 * 8);
      if (pjVar1->pAuxData == pChunk) {
        return pjVar1;
      }
    }
  }
  return (jx9_aux_data *)0x0;
}

Assistant:

static jx9_aux_data * ContextFindChunk(jx9_context *pCtx, void *pChunk)
{
	jx9_aux_data *aAux, *pAux;
	sxu32 n;
	if( SySetUsed(&pCtx->sChunk) < 1 ){
		/* Don't bother processing, the container is empty */
		return 0;
	}
	/* Perform the lookup */
	aAux = (jx9_aux_data *)SySetBasePtr(&pCtx->sChunk);
	for( n = 0; n < SySetUsed(&pCtx->sChunk) ; ++n ){
		pAux = &aAux[n];
		if( pAux->pAuxData == pChunk ){
			/* Chunk found */
			return pAux;
		}
	}
	/* No such allocated chunk */
	return 0;
}